

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<(ChArchiveOut *this,ChNameValue<chrono::ChFrame<double>_> *bVal)

{
  ChNameValue<chrono::ChFrame<double>_> local_30;
  ChNameValue<chrono::ChFrame<double>_> *local_18;
  ChNameValue<chrono::ChFrame<double>_> *bVal_local;
  ChArchiveOut *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<chrono::ChFrame<double>_> *)this;
  ChNameValue<chrono::ChFrame<double>_>::ChNameValue(&local_30,bVal);
  out<chrono::ChFrame<double>>(this,&local_30);
  ChNameValue<chrono::ChFrame<double>_>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }